

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O2

int envy_bios_parse_conn(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  uint8_t *res_01;
  byte bVar1;
  ushort uVar2;
  undefined2 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  envy_bios_conn_entry *peVar9;
  char *__format;
  uint uVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  uint8_t bytes [4];
  
  uVar2 = (bios->conn).offset;
  if (uVar2 == 0) {
    iVar8 = 0;
  }
  else {
    iVar4 = bios_u8(bios,(uint)uVar2,&(bios->conn).version);
    res = &(bios->conn).hlen;
    iVar5 = bios_u8(bios,(bios->conn).offset + 1,res);
    res_00 = &(bios->conn).entriesnum;
    iVar6 = bios_u8(bios,(bios->conn).offset + 2,res_00);
    res_01 = &(bios->conn).rlen;
    iVar7 = bios_u8(bios,(bios->conn).offset + 3,res_01);
    iVar8 = -0xe;
    if (iVar7 == 0 && (iVar6 == 0 && (iVar5 == 0 && iVar4 == 0))) {
      envy_bios_block(bios,(uint)(bios->conn).offset,
                      (uint)(bios->conn).entriesnum * (uint)(bios->conn).rlen +
                      (uint)(bios->conn).hlen,"CONN",-1);
      bVar14 = (bios->conn).rlen;
      uVar13 = (ulong)bVar14;
      bVar1 = (bios->conn).version;
      if ((bVar1 == 0x30) || (bVar1 == 0x40)) {
        bVar1 = *res;
        if (bVar1 < 5) {
          __format = "CONN table header too short [%d < %d]\n";
          uVar11 = 5;
          uVar13 = (ulong)(uint)bVar1;
        }
        else {
          uVar10 = (uint)(3 < bVar14) * 2 + 2;
          if (uVar10 < bVar14 || uVar10 == bVar14) {
            if (bVar1 != 5) {
              fprintf(_stderr,"CONN table header longer than expected [%d > %d]\n",
                      (ulong)(uint)bVar1);
              uVar13 = (ulong)*res_01;
            }
            if (uVar10 < (uint)uVar13) {
              fprintf(_stderr,"CONN table record longer than expected [%d > %d]\n");
            }
            bVar14 = (bios->conn).entriesnum;
            peVar9 = (envy_bios_conn_entry *)calloc((ulong)bVar14,10);
            (bios->conn).entries = peVar9;
            if (peVar9 == (envy_bios_conn_entry *)0x0) {
              return -0xc;
            }
            uVar13 = 0;
            do {
              if (bVar14 <= uVar13) {
                (bios->conn).valid = '\x01';
                return 0;
              }
              peVar9 = (bios->conn).entries;
              uVar3 = (bios->conn).offset;
              peVar9[uVar13].offset =
                   (ushort)(bios->conn).rlen * (short)uVar13 + (ushort)(bios->conn).hlen + uVar3;
              bytes[0] = '\0';
              bytes[1] = '\0';
              bytes[2] = '\0';
              bytes[3] = '\0';
              peVar9[uVar13].hpd = -1;
              peVar9[uVar13].dp_ext = -1;
              peVar9 = peVar9 + uVar13;
              bVar14 = 0;
              uVar10 = 0;
              for (uVar11 = 0; (uVar11 != 4 && (uVar11 < *res_01)); uVar11 = uVar11 + 1) {
                iVar8 = bios_u8(bios,(uint)peVar9->offset + (int)uVar11,bytes + uVar11);
                if (iVar8 != 0) {
                  return -0xe;
                }
                uVar10 = uVar10 | (uint)bytes[uVar11] << (bVar14 & 0x1f);
                bVar14 = bVar14 + 8;
              }
              peVar9->type = bytes[0];
              peVar9->tag = bytes[1] & 0xf;
              piVar12 = envy_bios_parse_conn::hpds;
              for (lVar15 = 0; lVar15 != 7; lVar15 = lVar15 + 1) {
                if ((uVar10 >> (*piVar12 & 0x1fU) & 1) != 0) {
                  if (peVar9->hpd == -1) {
                    peVar9->hpd = (int8_t)lVar15;
                  }
                  else {
                    fprintf(_stderr,"CONN %d: duplicate HPD bits\n",uVar13);
                  }
                }
                piVar12 = (int *)((uint *)piVar12 + 1);
              }
              for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
                if (((uVar10 >> ((byte)iVar8 & 0x1f)) >> 0xe & 1) != 0) {
                  if (peVar9->dp_ext == -1) {
                    peVar9->dp_ext = (byte)iVar8;
                  }
                  else {
                    fprintf(_stderr,"CONN %d: duplicate DP_AUX bits\n",uVar13 & 0xffffffff);
                  }
                }
              }
              peVar9->unk02_2 = bytes[2] >> 2 & 3;
              peVar9->unk02_4 = bytes[2] >> 4 & 7;
              peVar9->unk02_7 = bytes[2] >> 7;
              peVar9->unk03_3 = bytes[3] >> 3;
              uVar13 = uVar13 + 1;
              bVar14 = *res_00;
            } while( true );
          }
          __format = "CONN table record too short [%d < %d]\n";
          uVar11 = (ulong)uVar10;
        }
      }
      else {
        uVar13 = (ulong)(bVar1 >> 4);
        uVar11 = (ulong)(bVar1 & 0xf);
        __format = "Unknown CONN table version %d.%d\n";
      }
      fprintf(_stderr,__format,uVar13,uVar11);
      iVar8 = -0x16;
    }
  }
  return iVar8;
}

Assistant:

int envy_bios_parse_conn (struct envy_bios *bios) {
	struct envy_bios_conn *conn = &bios->conn;
	if (!conn->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, conn->offset, &conn->version);
	err |= bios_u8(bios, conn->offset+1, &conn->hlen);
	err |= bios_u8(bios, conn->offset+2, &conn->entriesnum);
	err |= bios_u8(bios, conn->offset+3, &conn->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, conn->offset, conn->hlen + conn->rlen * conn->entriesnum, "CONN", -1);
	int wanthlen = 5;
	int wantrlen = 4;
	if (conn->rlen < 4)
		wantrlen = 2;
	switch (conn->version) {
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown CONN table version %d.%d\n", conn->version >> 4, conn->version & 0xf);
			return -EINVAL;
	}
	if (conn->hlen < wanthlen) {
		ENVY_BIOS_ERR("CONN table header too short [%d < %d]\n", conn->hlen, wanthlen);
		return -EINVAL;
	}
	if (conn->rlen < wantrlen) {
		ENVY_BIOS_ERR("CONN table record too short [%d < %d]\n", conn->rlen, wantrlen);
		return -EINVAL;
	}
	if (conn->hlen > wanthlen) {
		ENVY_BIOS_WARN("CONN table header longer than expected [%d > %d]\n", conn->hlen, wanthlen);
	}
	if (conn->rlen > wantrlen) {
		ENVY_BIOS_WARN("CONN table record longer than expected [%d > %d]\n", conn->rlen, wantrlen);
	}
	conn->entries = calloc(conn->entriesnum, sizeof *conn->entries);
	if (!conn->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < conn->entriesnum; i++) {
		struct envy_bios_conn_entry *entry = &conn->entries[i];
		entry->offset = conn->offset + conn->hlen + conn->rlen * i;
		uint8_t bytes[4] = { 0 };
		uint32_t val = 0;
		int j;
		static const int hpds[7] = { 12, 13, 16, 17, 24, 25, 26 };
		entry->hpd = -1;
		entry->dp_ext = -1;
		for (j = 0; j < 4 && j < conn->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
			val |= bytes[j] << j * 8;
		}
		entry->type = bytes[0];
		entry->tag = bytes[1] & 0xf;
		for (j = 0; j < 7; j++) {
			if (val & 1 << hpds[j]) {
				if (entry->hpd == -1)
					entry->hpd = j;
				else
					ENVY_BIOS_ERR("CONN %d: duplicate HPD bits\n", i);
			}
		}
		for (j = 0; j < 2; j++) {
			if (val & 1 << (j+14)) {
				if (entry->dp_ext == -1)
					entry->dp_ext = j;
				else
					ENVY_BIOS_ERR("CONN %d: duplicate DP_AUX bits\n", i);
			}
		}
		entry->unk02_2 = bytes[2] >> 2 & 3;
		entry->unk02_4 = bytes[2] >> 4 & 7;
		entry->unk02_7 = bytes[2] >> 7 & 1;
		entry->unk03_3 = bytes[3] >> 3 & 0x1f;
	}
	conn->valid = 1;
	return 0;
}